

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void opj_j2k_read_int32_to_float(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  ulong in_RAX;
  long lVar1;
  ulong uStack_38;
  OPJ_UINT32 l_temp;
  
  uStack_38 = in_RAX;
  for (lVar1 = 0; p_nb_elem != (OPJ_UINT32)lVar1; lVar1 = lVar1 + 1) {
    opj_read_bytes_LE((OPJ_BYTE *)p_src_data,&l_temp,4);
    p_src_data = (void *)((long)p_src_data + 4);
    *(float *)((long)p_dest_data + lVar1 * 4) = (float)(uStack_38 >> 0x20);
  }
  return;
}

Assistant:

static void  opj_j2k_read_int32_to_float(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
    OPJ_FLOAT32 * l_dest_data = (OPJ_FLOAT32 *) p_dest_data;
    OPJ_UINT32 i;
    OPJ_UINT32 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        opj_read_bytes(l_src_data, &l_temp, 4);

        l_src_data += sizeof(OPJ_INT32);

        *(l_dest_data++) = (OPJ_FLOAT32) l_temp;
    }
}